

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_ManReadInstance(Prs_Man_t *p,int Func)

{
  int InstName;
  int iVar1;
  int Entry;
  byte bVar2;
  ulong uVar3;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint uVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  pbVar6 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
  while( true ) {
    if (pbVar6 <= pbVar5) goto LAB_0034acbd;
    while( true ) {
      bVar2 = *pbVar5;
      uVar3 = (ulong)bVar2;
      if (0x2f < uVar3) goto LAB_0034abdc;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
    }
    if (uVar3 != 0x2f) break;
    if (pbVar5[1] == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_0034abda;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_0034abda;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (pbVar5[1] != 0x2f) goto LAB_0034ad1f;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) {
LAB_0034abda:
        bVar2 = *pbVar5;
        goto LAB_0034abdc;
      }
      while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_0034abda;
      }
    }
    p->pCur = (char *)pbVar5;
  }
  if (uVar3 == 0) goto LAB_0034acbd;
LAB_0034abdc:
  if (bVar2 != 0x23) goto LAB_0034ac91;
  do {
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  } while (0xf5 < (byte)(*pbVar5 - 0x3a));
  while (pbVar5 < pbVar6) {
    while( true ) {
      bVar2 = *pbVar5;
      uVar3 = (ulong)bVar2;
      if (0x2f < uVar3) goto LAB_0034ac93;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
    }
    if (uVar3 != 0x2f) {
      if (uVar3 != 0) goto LAB_0034ac93;
      break;
    }
    if (pbVar5[1] == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_0034ac91;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_0034ac91;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (pbVar5[1] != 0x2f) goto LAB_0034ad1f;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_0034ac91;
      while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_0034ac91;
      }
    }
    p->pCur = (char *)pbVar5;
  }
LAB_0034acbd:
  if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
  builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
  if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
  uVar11._0_1_ = ' ';
  uVar11._1_1_ = '2';
  uVar11._2_1_ = '5';
  uVar11._3_1_ = '.';
  goto LAB_0034ad07;
LAB_0034ad1f:
  bVar2 = 0x2f;
LAB_0034ad21:
  if ((bVar2 == 0x5f) || (iVar1 = 0, 0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar6 = pbVar5 + 1;
    do {
      do {
        p->pCur = (char *)pbVar6;
        bVar2 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    goto LAB_0034ad5d;
  }
  goto LAB_0034ae19;
LAB_0034af2a:
  uVar4 = (uint)in_RDX;
  pbVar6 = pbVar5 + 1;
  p->pCur = (char *)pbVar6;
  bVar2 = pbVar5[1];
  if (bVar2 == 0x5c) {
    pbVar6 = pbVar5 + 2;
    pbVar5 = pbVar6;
    do {
      p->pCur = (char *)pbVar5;
      bVar2 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar2 != 0x20);
LAB_0034af9a:
    iVar1 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar6,(char *)(pbVar5 + -1),(int *)0x0);
    uVar4 = (uint)extraout_RDX_00;
    if (iVar1 != 0) {
      pbVar6 = (byte *)p->pLimit;
      pbVar5 = (byte *)p->pCur;
      uVar3 = extraout_RDX_00;
      do {
        uVar4 = (uint)uVar3;
        if (pbVar6 <= pbVar5) goto LAB_0034b373;
        while( true ) {
          uVar3 = (ulong)*pbVar5;
          uVar4 = (uint)*pbVar5;
          if (0x2f < uVar3) goto LAB_0034b04f;
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar3 != 0x2f) {
          if (uVar3 == 0) goto LAB_0034b373;
          goto LAB_0034b04f;
        }
        bVar2 = pbVar5[1];
        uVar3 = (ulong)bVar2;
        uVar4 = (uint)bVar2;
        if (bVar2 == 0x2a) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_0034b04d;
          while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
            pbVar5 = pbVar5 + 1;
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_0034b04d;
          }
          pbVar5 = pbVar5 + 2;
        }
        else {
          if (bVar2 != 0x2f) goto LAB_0034b50e;
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_0034b04d;
          while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_0034b04d;
          }
        }
        p->pCur = (char *)pbVar5;
      } while( true );
    }
  }
  else if ((bVar2 == 0x5f) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar5 = pbVar5 + 2;
    do {
      do {
        p->pCur = (char *)pbVar5;
        bVar2 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    goto LAB_0034af9a;
  }
  if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
  builtin_strncpy(p->ErrorStr,"Cannot read formal name of the instance.",0x29);
  goto LAB_0034b608;
LAB_0034b04d:
  uVar3 = (ulong)*pbVar5;
LAB_0034b04f:
  uVar4 = (uint)uVar3;
  if ((char)uVar3 == '(') {
    while( true ) {
      pbVar5 = pbVar5 + 1;
      while( true ) {
        uVar4 = (uint)uVar3;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_0034b373;
        while( true ) {
          uVar3 = (ulong)*pbVar5;
          uVar4 = (uint)*pbVar5;
          if (0x2f < uVar3) goto LAB_0034b0e2;
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar3 != 0x2f) {
          if (uVar3 == 0) goto LAB_0034b373;
          goto LAB_0034b0e2;
        }
        bVar2 = pbVar5[1];
        uVar3 = (ulong)bVar2;
        if (bVar2 != 0x2a) break;
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_0034b0e2;
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_0034b0e2;
        }
        pbVar5 = pbVar5 + 2;
      }
      if (bVar2 != 0x2f) break;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) break;
      while (*pbVar5 != 10) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_0034b0e2;
      }
    }
LAB_0034b0e2:
    Entry = Prs_ManReadSignal(p);
    uVar4 = (uint)extraout_RDX_01;
    if (Entry == 0) {
      if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
      builtin_strncpy(p->ErrorStr,"Cannot read actual name of an instance.",0x28);
      goto LAB_0034b608;
    }
    if (*p->pCur == ')') {
      pbVar5 = (byte *)(p->pCur + 1);
      p->pCur = (char *)pbVar5;
      in_RDX = extraout_RDX_01;
      if (Entry != 1) {
        Vec_IntPush(&p->vTemp,iVar1);
        Vec_IntPush(&p->vTemp,Entry);
        pbVar5 = (byte *)p->pCur;
        in_RDX = extraout_RDX_02;
      }
      uVar4 = (uint)in_RDX;
      pbVar6 = (byte *)p->pLimit;
      do {
        if (pbVar6 <= pbVar5) {
LAB_0034b4ac:
          if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
          uVar12._0_1_ = ' ';
          uVar12._1_1_ = '1';
          uVar12._2_1_ = '8';
          uVar12._3_1_ = '.';
          goto LAB_0034b4f6;
        }
        while( true ) {
          bVar2 = *pbVar5;
          uVar3 = (ulong)bVar2;
          if (0x2f < uVar3) goto LAB_0034b1d3;
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar3 != 0x2f) {
          if (uVar3 == 0) goto LAB_0034b4ac;
          goto LAB_0034b1d3;
        }
        if (pbVar5[1] == 0x2a) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_0034b1d1;
          while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
            pbVar5 = pbVar5 + 1;
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_0034b1d1;
          }
          pbVar5 = pbVar5 + 2;
        }
        else {
          if (pbVar5[1] != 0x2f) goto LAB_0034b57e;
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_0034b1d1;
          while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_0034b1d1;
          }
        }
        p->pCur = (char *)pbVar5;
      } while( true );
    }
    if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar8._0_1_ = 'C';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 'n';
    uVar9._0_1_ = 'o';
    uVar9._1_1_ = 't';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 'r';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'd';
    uVar10._3_1_ = ' ';
    uVar13._0_1_ = '\"';
    uVar13._1_1_ = ')';
    uVar13._2_1_ = '\"';
    uVar13._3_1_ = ' ';
  }
  else {
LAB_0034b50e:
    if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar8._0_1_ = 'C';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 'n';
    uVar9._0_1_ = 'o';
    uVar9._1_1_ = 't';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 'r';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'd';
    uVar10._3_1_ = ' ';
    uVar13._0_1_ = '\"';
    uVar13._1_1_ = '(';
    uVar13._2_1_ = '\"';
    uVar13._3_1_ = ' ';
  }
  goto LAB_0034b601;
LAB_0034b1d1:
  bVar2 = *pbVar5;
LAB_0034b1d3:
  if (bVar2 == 0x2c) {
    pbVar5 = pbVar5 + 1;
LAB_0034b1df:
    do {
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) {
LAB_0034b2af:
        if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
        uVar12._0_1_ = ' ';
        uVar12._1_1_ = '1';
        uVar12._2_1_ = '9';
        uVar12._3_1_ = '.';
        goto LAB_0034b4f6;
      }
      while( true ) {
        bVar2 = *pbVar5;
        uVar3 = (ulong)bVar2;
        if (0x2f < uVar3) goto LAB_0034b272;
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar3 != 0x2f) {
        if (uVar3 == 0) goto LAB_0034b2af;
        goto LAB_0034b272;
      }
      if (pbVar5[1] != 0x2a) {
        if (pbVar5[1] != 0x2f) {
          bVar2 = 0x2f;
          goto LAB_0034b61e;
        }
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_0034b270;
        while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_0034b270;
        }
        goto LAB_0034b1df;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_0034b270;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_0034b270;
      }
      pbVar5 = pbVar5 + 2;
    } while( true );
  }
  if (bVar2 == 0x29) goto LAB_0034b61e;
LAB_0034b57e:
  if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
  builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
  uVar8._0_1_ = 'E';
  uVar8._1_1_ = 'x';
  uVar8._2_1_ = 'p';
  uVar8._3_1_ = 'e';
  uVar9._0_1_ = 'c';
  uVar9._1_1_ = 't';
  uVar9._2_1_ = 'i';
  uVar9._3_1_ = 'n';
  uVar10._0_1_ = 'g';
  uVar10._1_1_ = ' ';
  uVar10._2_1_ = 'c';
  uVar10._3_1_ = 'o';
  uVar13._0_1_ = 'm';
  uVar13._1_1_ = 'm';
  uVar13._2_1_ = 'a';
  uVar13._3_1_ = ' ';
LAB_0034b601:
  *(undefined4 *)p->ErrorStr = uVar8;
  *(undefined4 *)(p->ErrorStr + 4) = uVar9;
  *(undefined4 *)(p->ErrorStr + 8) = uVar10;
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar13;
  p->ErrorStr[0x20] = '\0';
  goto LAB_0034b608;
LAB_0034b270:
  bVar2 = *pbVar5;
LAB_0034b272:
  if (bVar2 != 0x2e) goto LAB_0034b61e;
  goto LAB_0034af2a;
LAB_0034b61e:
  uVar4 = (p->vTemp).nSize;
  if ((int)uVar4 < 1) {
    __assert_fail("Vec_IntSize(vTemp) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                  ,0x29a,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
  }
  if ((uVar4 & 1) != 0) {
    __assert_fail("Vec_IntSize(vTemp) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                  ,0x29b,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
  }
LAB_0034b33b:
  if (bVar2 != 0x29) {
    __assert_fail("Prs_ManIsChar(p, \')\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                  ,0x46a,"int Prs_ManReadInstance(Prs_Man_t *, int)");
  }
  p->pCur = (char *)(pbVar5 + 1);
  iVar1 = Prs_ManUtilSkipSpaces(p);
  uVar4 = extraout_EDX_01;
  if (iVar1 == 0) {
    if (*p->pCur == ';') {
      Prs_NtkAddBox(p->pNtk,Func,InstName,&p->vTemp);
      return 1;
    }
    pcVar7 = "Expecting semicolon in the instance.";
  }
  else {
    pcVar7 = "Error number 29.";
  }
  goto LAB_0034b60f;
LAB_0034b373:
  if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
  builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
  if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
  uVar12._0_1_ = ' ';
  uVar12._1_1_ = '1';
  uVar12._2_1_ = '7';
  uVar12._3_1_ = '.';
LAB_0034b4f6:
  p->ErrorStr[0] = 'E';
  p->ErrorStr[1] = 'r';
  p->ErrorStr[2] = 'r';
  p->ErrorStr[3] = 'o';
  p->ErrorStr[4] = 'r';
  p->ErrorStr[5] = ' ';
  p->ErrorStr[6] = 'n';
  p->ErrorStr[7] = 'u';
  p->ErrorStr[8] = 'm';
  p->ErrorStr[9] = 'b';
  p->ErrorStr[10] = 'e';
  p->ErrorStr[0xb] = 'r';
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar12;
  p->ErrorStr[0x10] = '\0';
LAB_0034b608:
  pcVar7 = "Error number 28.";
LAB_0034b60f:
  Prs_ManErrorSet(p,pcVar7,uVar4);
  return 0;
LAB_0034ac91:
  bVar2 = *pbVar5;
LAB_0034ac93:
  if (bVar2 != 0x5c) goto LAB_0034ad21;
  pbVar5 = pbVar5 + 1;
  pbVar6 = pbVar5;
  do {
    p->pCur = (char *)pbVar6;
    bVar2 = *pbVar6;
    pbVar6 = pbVar6 + 1;
  } while (bVar2 != 0x20);
LAB_0034ad5d:
  InstName = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar5,(char *)(pbVar6 + -1),(int *)0x0);
  pbVar5 = (byte *)p->pCur;
  in_RDX = extraout_RDX;
  iVar1 = 0;
  if (InstName != 0) {
    pbVar6 = (byte *)p->pLimit;
    while (pbVar5 < pbVar6) {
      while( true ) {
        bVar2 = *pbVar5;
        uVar3 = (ulong)bVar2;
        if (0x2f < uVar3) goto LAB_0034ae1e;
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar3 != 0x2f) {
        if (uVar3 != 0) goto LAB_0034ae1e;
        break;
      }
      iVar1 = InstName;
      if (pbVar5[1] == 0x2a) {
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_0034ae19;
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_0034ae19;
        }
        pbVar5 = pbVar5 + 2;
      }
      else {
        if (pbVar5[1] != 0x2f) goto LAB_0034aecb;
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_0034ae19;
        while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_0034ae19;
        }
      }
      p->pCur = (char *)pbVar5;
    }
    if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] != '\0') goto LAB_0034b650;
    uVar11._0_1_ = ' ';
    uVar11._1_1_ = '2';
    uVar11._2_1_ = '6';
    uVar11._3_1_ = '.';
    goto LAB_0034ad07;
  }
LAB_0034ae19:
  InstName = iVar1;
  bVar2 = *pbVar5;
LAB_0034ae1e:
  if (bVar2 == 0x28) {
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
    pbVar6 = (byte *)p->pLimit;
    while (pbVar5 < pbVar6) {
      while( true ) {
        bVar2 = *pbVar5;
        uVar3 = (ulong)bVar2;
        if (0x2f < uVar3) goto LAB_0034af09;
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar3 != 0x2f) {
        if (uVar3 != 0) {
LAB_0034af09:
          if (bVar2 == 0x2e) {
            (p->vTemp).nSize = 0;
            if (*pbVar5 != 0x2e) {
              __assert_fail("Prs_ManIsChar(p, \'.\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                            ,0x284,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
            }
            goto LAB_0034af2a;
          }
LAB_0034b2fe:
          pcVar7 = Abc_NamStr(p->pStrs,Func);
          Func = Prs_ManIsVerilogPrim(pcVar7);
          if (Func == 0) {
            pcVar7 = "Cannot find elementary gate.";
            uVar4 = extraout_EDX;
            goto LAB_0034b60f;
          }
          iVar1 = Prs_ManReadSignalList(p,&p->vTemp,')',1);
          uVar4 = extraout_EDX_00;
          if (iVar1 == 0) goto LAB_0034b608;
          pbVar5 = (byte *)p->pCur;
          bVar2 = *pbVar5;
          goto LAB_0034b33b;
        }
        break;
      }
      if (pbVar5[1] == 0x2a) {
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) {
LAB_0034af07:
          bVar2 = *pbVar5;
          goto LAB_0034af09;
        }
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_0034af07;
        }
        pbVar5 = pbVar5 + 2;
      }
      else {
        if (pbVar5[1] != 0x2f) goto LAB_0034b2fe;
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_0034af07;
        while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_0034af07;
        }
      }
      p->pCur = (char *)pbVar5;
    }
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] == '\0') {
        uVar11._0_1_ = ' ';
        uVar11._1_1_ = '2';
        uVar11._2_1_ = '7';
        uVar11._3_1_ = '.';
LAB_0034ad07:
        p->ErrorStr[0] = 'E';
        p->ErrorStr[1] = 'r';
        p->ErrorStr[2] = 'r';
        p->ErrorStr[3] = 'o';
        p->ErrorStr[4] = 'r';
        p->ErrorStr[5] = ' ';
        p->ErrorStr[6] = 'n';
        p->ErrorStr[7] = 'u';
        p->ErrorStr[8] = 'm';
        p->ErrorStr[9] = 'b';
        p->ErrorStr[10] = 'e';
        p->ErrorStr[0xb] = 'r';
        *(undefined4 *)(p->ErrorStr + 0xc) = uVar11;
        p->ErrorStr[0x10] = '\0';
        return 0;
      }
    }
  }
  else {
LAB_0034aecb:
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Expecting \"(\" in module instantiation.",0x27);
      return 0;
    }
  }
LAB_0034b650:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
}

Assistant:

static inline int Prs_ManReadInstance( Prs_Man_t * p, int Func )
{
    int InstId, Status;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 25.", 0);
    if ( Prs_ManIsChar(p, '#') )
    {
        p->pCur++;
        while ( Prs_ManIsDigit(p) )
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 25.", 0);
    }
    if ( (InstId = Prs_ManReadName(p)) )
        if (Prs_ManUtilSkipSpaces(p))       return Prs_ManErrorSet(p, "Error number 26.", 0);
    if ( !Prs_ManIsChar(p, '(') )           return Prs_ManErrorSet(p, "Expecting \"(\" in module instantiation.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 27.", 0);
    if ( Prs_ManIsChar(p, '.') ) // box
        Status = Prs_ManReadSignalList2(p, &p->vTemp);
    else  // node
    {
        //char * s = Abc_NamStr(p->pStrs, Func);
        // translate elementary gate
        int iFuncNew = Prs_ManIsVerilogPrim(Abc_NamStr(p->pStrs, Func));
        if ( iFuncNew == 0 )                return Prs_ManErrorSet(p, "Cannot find elementary gate.", 0);
        Func = iFuncNew;
        Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
    }
    if ( Status == 0 )                      return Prs_ManErrorSet(p, "Error number 28.", 0);
    assert( Prs_ManIsChar(p, ')') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 29.", 0);
    if ( !Prs_ManIsChar(p, ';') )           return Prs_ManErrorSet(p, "Expecting semicolon in the instance.", 0);
    // add box 
    Prs_NtkAddBox( p->pNtk, Func, InstId, &p->vTemp );
    return 1;
}